

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.c
# Opt level: O2

HT_ErrorCode
ht_registry_register_listener_container(char *name,HT_TimelineListenerContainer *container)

{
  uint32_t id;
  HT_ErrorCode HVar1;
  HT_TimelineListenerContainer *pHVar2;
  
  pHVar2 = ht_registry_find_listener_container(name);
  if (pHVar2 == (HT_TimelineListenerContainer *)0x0) {
    ht_mutex_lock(listeners_register_mutex);
    id = djb2_hash(name);
    ht_timeline_listener_container_set_id(container,id);
    ht_timeline_listener_container_ref(container);
    HVar1 = ht_bag_void_ptr_add(&listeners_register,container);
    ht_mutex_unlock(listeners_register_mutex);
  }
  else {
    HVar1 = HT_ERR_LISTENER_CONTAINER_ALREADY_REGISTERED;
  }
  return HVar1;
}

Assistant:

HT_ErrorCode
ht_registry_register_listener_container(const char* name, HT_TimelineListenerContainer* container)
{
    HT_ErrorCode error_code;

    if (ht_registry_find_listener_container(name) != NULL)
    {
        return HT_ERR_LISTENER_CONTAINER_ALREADY_REGISTERED;
    }

    ht_mutex_lock(listeners_register_mutex);
    ht_timeline_listener_container_set_id(container, djb2_hash(name));
    ht_timeline_listener_container_ref(container);

    error_code = ht_bag_void_ptr_add(&listeners_register, container);
    if (error_code != HT_ERR_OK)
    {
        ht_mutex_unlock(listeners_register_mutex);
        return error_code;
    }

    ht_mutex_unlock(listeners_register_mutex);

    return HT_ERR_OK;
}